

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pbf-decoder.cpp
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_56ca::decode_message
          (anon_unknown_dwarf_56ca *this,stringstream *out,string *indent,data_view view)

{
  anon_unknown_dwarf_56ca *this_00;
  char *data;
  ostream *poVar1;
  string *indent_00;
  exception *anon_var_0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  undefined1 local_50 [8];
  string nested;
  string *indent_local;
  stringstream *out_local;
  data_view view_local;
  
  indent_00 = (string *)view.m_size;
  view_local.m_data = view.m_data;
  nested.field_2._8_8_ = out;
  out_local = (stringstream *)indent;
  this_00 = (anon_unknown_dwarf_56ca *)protozero::data_view::data((data_view *)&out_local);
  data = (char *)protozero::data_view::size((data_view *)&out_local);
  std::operator+(&local_70,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 nested.field_2._8_8_,"  ");
  decode((string *)local_50,this_00,data,(size_t)&local_70,indent_00);
  std::__cxx11::string::~string((string *)&local_70);
  poVar1 = std::operator<<((ostream *)(this + 0x10),'\n');
  std::operator<<(poVar1,(string *)local_50);
  view_local.m_size._7_1_ = 1;
  std::__cxx11::string::~string((string *)local_50);
  return (bool)(view_local.m_size._7_1_ & 1);
}

Assistant:

bool decode_message(std::stringstream& out, const std::string& indent, const protozero::data_view view) {
    try {
        const auto nested = decode(view.data(), view.size(), indent + "  ");
        out << '\n' << nested;
        return true;
    } catch (const protozero::exception&) { // NOLINT(bugprone-empty-catch)
    }
    return false;
}